

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeProperties(JUnitTestOutput *this)

{
  SimpleString local_40 [2];
  SimpleString local_20;
  JUnitTestOutput *local_10;
  JUnitTestOutput *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"<properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"</properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,local_40);
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

void JUnitTestOutput::writeProperties()
{
    writeToFile("<properties>\n");
    writeToFile("</properties>\n");
}